

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O0

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  int i_1;
  float *r0_1;
  float k0_1;
  float *kernel0_1;
  float *img0_1;
  float *outptr_1;
  float sum3;
  float sum2;
  float sum1;
  float sum;
  int remain;
  int i;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float k3;
  float k2;
  float k1;
  float k0;
  float *kernel0;
  float *img3;
  float *img2;
  float *img1;
  float *img0;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffd40;
  int c;
  Mat *in_stack_fffffffffffffd48;
  Mat *in_stack_fffffffffffffd50;
  float local_270;
  int local_268;
  int local_264;
  float *local_260;
  Mat local_248;
  float *local_210;
  Mat *local_208;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  int local_1f0;
  int local_1ec;
  Mat *local_1e8;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float *local_1b8;
  Mat local_1b0;
  Mat *local_178;
  Mat local_170;
  float *local_138;
  Mat local_130;
  float *local_f8;
  Mat local_f0;
  float *local_b8;
  float *local_a0;
  int local_98;
  float local_94;
  Mat local_90;
  int local_54;
  float *local_50;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x24);
  local_30 = *(int *)(in_RDI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x24);
  local_38 = *(int *)(in_RSI + 0x28);
  local_3c = *(int *)(in_RSI + 0x2c);
  local_40 = local_2c * 2 + local_34 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    Mat::channel(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    if (local_50 == (float *)0x0) {
      local_270 = 0.0;
    }
    else {
      local_270 = local_50[local_54];
    }
    local_94 = local_270;
    Mat::fill(in_stack_fffffffffffffd50,(float)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    for (local_98 = 0; local_98 + 3 < local_30; local_98 = local_98 + 4) {
      local_a0 = Mat::operator_cast_to_float_(&local_90);
      Mat::channel(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_f0);
      Mat::~Mat((Mat *)0x114628);
      local_b8 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_130);
      Mat::~Mat((Mat *)0x114676);
      local_f8 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_170);
      Mat::~Mat((Mat *)0x1146c5);
      local_138 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      in_stack_fffffffffffffd50 = (Mat *)Mat::operator_cast_to_float_(&local_1b0);
      Mat::~Mat((Mat *)0x114712);
      local_1b8 = local_48 + (long)(local_54 * local_30) + (long)local_98;
      local_1bc = *local_1b8;
      local_1c0 = local_1b8[1];
      local_1c4 = local_1b8[2];
      local_1c8 = local_1b8[3];
      local_1d0 = local_b8;
      local_1d8 = local_f8;
      local_1e0 = local_138;
      local_1e8 = in_stack_fffffffffffffd50;
      for (local_1ec = 0; local_1ec < local_38; local_1ec = local_1ec + 1) {
        for (local_1f0 = local_34; 0 < local_1f0; local_1f0 = local_1f0 + -1) {
          local_1f4 = *local_1d0 * local_1bc;
          local_1f8 = *local_1d8 * local_1c0;
          local_1fc = *local_1e0 * local_1c4;
          local_200 = *(float *)&local_1e8->data * local_1c8;
          *local_a0 = local_1f4 + local_1f8 + local_1fc + local_200 + *local_a0;
          local_1d0 = local_1d0 + 2;
          local_1d8 = local_1d8 + 2;
          local_1e0 = local_1e0 + 2;
          local_1e8 = (Mat *)&local_1e8->refcount;
          local_a0 = local_a0 + 1;
        }
        local_1d0 = local_1d0 + local_40;
        local_1d8 = local_1d8 + local_40;
        local_1e0 = local_1e0 + local_40;
        local_1e8 = (Mat *)((long)&local_1e8->data + (long)local_40 * 4);
      }
      local_178 = in_stack_fffffffffffffd50;
    }
    for (; c = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20), local_98 < local_30;
        local_98 = local_98 + 1) {
      in_stack_fffffffffffffd48 = (Mat *)Mat::operator_cast_to_float_(&local_90);
      local_208 = in_stack_fffffffffffffd48;
      Mat::channel(in_stack_fffffffffffffd48,c);
      in_stack_fffffffffffffd40 = Mat::operator_cast_to_float_(&local_248);
      Mat::~Mat((Mat *)0x114a9b);
      fVar1 = local_48[(long)(local_54 * local_30) + (long)local_98];
      local_260 = in_stack_fffffffffffffd40;
      for (local_264 = 0; local_264 < local_38; local_264 = local_264 + 1) {
        for (local_268 = local_34; 0 < local_268; local_268 = local_268 + -1) {
          *(float *)&local_208->data = *local_260 * fVar1 + *(float *)&local_208->data;
          local_260 = local_260 + 2;
          local_208 = (Mat *)((long)&local_208->data + 4);
        }
        local_260 = local_260 + local_40;
      }
      local_210 = in_stack_fffffffffffffd40;
    }
    Mat::~Mat((Mat *)0x114bce);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}